

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

string * google::protobuf::compiler::anon_unknown_0::PluginName
                   (string *__return_storage_ptr__,string *plugin_prefix,string *directive)

{
  string *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *directive_local;
  string *plugin_prefix_local;
  
  local_20 = directive;
  directive_local = plugin_prefix;
  plugin_prefix_local = __return_storage_ptr__;
  std::operator+(&local_40,plugin_prefix,"gen-");
  psVar1 = local_20;
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)&local_60,(ulong)psVar1);
  std::operator+(__return_storage_ptr__,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

string PluginName(const string& plugin_prefix, const string& directive) {
  // Assuming the directive starts with "--" and ends with "_out" or "_opt",
  // strip the "--" and "_out/_opt" and add the plugin prefix.
  return plugin_prefix + "gen-" + directive.substr(2, directive.size() - 6);
}